

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

reporterMap * doctest::anon_unknown_14::getListeners(void)

{
  undefined1 extraout_AL;
  undefined7 in_register_00000001;
  undefined7 extraout_var;
  
  if ((anonymous_namespace)::getListeners()::data != '\0') {
    return (reporterMap *)CONCAT71(in_register_00000001,(anonymous_namespace)::getListeners()::data)
    ;
  }
  _GLOBAL__N_1::getListeners();
  return (reporterMap *)CONCAT71(extraout_var,extraout_AL);
}

Assistant:

reporterMap& getListeners() {
        static reporterMap data;
        return data;
    }